

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cc
# Opt level: O1

void __thiscall ReportAsync::SendReport(ReportAsync *this,Report *report)

{
  mutex *__mutex;
  undefined8 uVar1;
  int iVar2;
  
  __mutex = &this->queue_lock_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    if (this->terminated_ == false) {
      if ((this->reporter_thread_)._M_t.
          super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
          super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
          super__Head_base<0UL,_std::thread_*,_false>._M_head_impl == (thread *)0x0) {
        StartThread(this);
      }
      std::
      deque<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
      ::emplace_back<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((deque<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  *)&this->queue_,report);
      std::condition_variable::notify_all();
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar1 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar1);
}

Assistant:

void SendReport(Report report) override {
    std::lock_guard<std::mutex> lock(queue_lock_);
    if (!terminated_) {
      if (!reporter_thread_) {
        StartThread();
      }
      // This assumes that the rate at which SendReport is called does not
      // exceed the rate at which reports can be written, on average. Since that
      // isn't always a safe assumption, it might be helpful to limit the queue
      // size and either wait or drop reports if that limit is exceeded here.
      queue_.push(std::move(report));
      queue_wait_.notify_all();
    }
  }